

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O1

void Hacl_Hash_MD5_digest(Hacl_Streaming_MD_state_32 *state,uint8_t *output)

{
  ulong uVar1;
  uint input_len;
  uint uVar2;
  ulong uVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar1 = state->total_len;
  uVar2 = (uint)uVar1 & 0x3f;
  input_len = 0x40;
  if ((uVar1 & 0x3f) != 0) {
    input_len = uVar2;
  }
  if (uVar1 == 0) {
    input_len = uVar2;
  }
  local_28 = *(undefined8 *)state->block_state;
  uStack_20 = *(undefined8 *)(state->block_state + 2);
  uVar2 = input_len & 0x3f;
  uVar3 = 0x40;
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2;
  }
  if (input_len == 0) {
    uVar3 = (ulong)uVar2;
  }
  Hacl_Hash_MD5_update_last
            ((uint32_t *)&local_28,uVar1 - input_len,state->buf + (input_len - uVar3),input_len);
  *(uint32_t *)output = (uint32_t)local_28;
  *(undefined4 *)(output + 4) = local_28._4_4_;
  *(undefined4 *)(output + 8) = (undefined4)uStack_20;
  *(undefined4 *)(output + 0xc) = uStack_20._4_4_;
  return;
}

Assistant:

void Hacl_Hash_MD5_digest(Hacl_Streaming_MD_state_32 *state, uint8_t *output)
{
  Hacl_Streaming_MD_state_32 scrut = *state;
  uint32_t *block_state = scrut.block_state;
  uint8_t *buf_ = scrut.buf;
  uint64_t total_len = scrut.total_len;
  uint32_t r;
  if (total_len % (uint64_t)64U == 0ULL && total_len > 0ULL)
  {
    r = 64U;
  }
  else
  {
    r = (uint32_t)(total_len % (uint64_t)64U);
  }
  uint8_t *buf_1 = buf_;
  uint32_t tmp_block_state[4U] = { 0U };
  memcpy(tmp_block_state, block_state, 4U * sizeof (uint32_t));
  uint32_t ite;
  if (r % 64U == 0U && r > 0U)
  {
    ite = 64U;
  }
  else
  {
    ite = r % 64U;
  }
  uint8_t *buf_last = buf_1 + r - ite;
  uint8_t *buf_multi = buf_1;
  Hacl_Hash_MD5_update_multi(tmp_block_state, buf_multi, 0U);
  uint64_t prev_len_last = total_len - (uint64_t)r;
  Hacl_Hash_MD5_update_last(tmp_block_state, prev_len_last, buf_last, r);
  Hacl_Hash_MD5_finish(tmp_block_state, output);
}